

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyConcaveCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
btSoftBodyTriangleCallback::setTimeStepAndCounters
          (btSoftBodyTriangleCallback *this,btScalar collisionMarginTriangle,
          btCollisionObjectWrapper *triBodyWrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  btVector3 halfExtents;
  btVector3 aabbWorldSpaceMax;
  btVector3 aabbWorldSpaceMin;
  btTransform convexInTriangleSpace;
  btVector3 local_158;
  undefined1 local_148 [8];
  float local_140;
  undefined1 local_138 [8];
  float local_130;
  btTransform local_128;
  btTransform local_e8;
  btTransform local_a8;
  btTransform local_68;
  
  this->m_dispatchInfoPtr = dispatchInfo;
  this->m_collisionMarginTriangle = collisionMarginTriangle + 0.06;
  this->m_resultOut = resultOut;
  (*(this->m_softBody->super_btCollisionObject)._vptr_btCollisionObject[7])
            (this->m_softBody,local_138,local_148);
  local_158.m_floats[1] = (local_148._4_4_ - local_138._4_4_) * 0.5;
  local_158.m_floats[0] = (local_148._0_4_ - local_138._0_4_) * 0.5;
  local_158.m_floats[2] = (local_140 - local_130) * 0.5;
  local_158.m_floats[3] = 0.0;
  local_68.m_basis.m_el[0].m_floats[0] = 1.0;
  local_68.m_basis.m_el[0].m_floats[1] = 0.0;
  local_68.m_basis.m_el[0].m_floats[2] = 0.0;
  local_68.m_basis.m_el[0].m_floats[3] = 0.0;
  local_68.m_basis.m_el[1].m_floats[0] = 0.0;
  local_68.m_basis.m_el[1].m_floats[1] = 1.0;
  local_68.m_basis.m_el[1].m_floats[2] = 0.0;
  local_68.m_basis.m_el[1].m_floats[3] = 0.0;
  local_68.m_basis.m_el[2].m_floats[0] = 0.0;
  local_68.m_basis.m_el[2].m_floats[1] = 0.0;
  local_68.m_basis.m_el[2].m_floats[2] = 1.0;
  local_68.m_basis.m_el[2].m_floats[3] = 0.0;
  local_68.m_origin.m_floats[1] = (local_148._4_4_ + local_138._4_4_) * 0.5;
  local_68.m_origin.m_floats[0] = (local_148._0_4_ + local_138._0_4_) * 0.5;
  local_68.m_origin.m_floats[2] = (local_140 + local_130) * 0.5;
  local_68.m_origin.m_floats[3] = 0.0;
  btTransform::inverse(&local_e8,triBodyWrap->m_worldTransform);
  btTransform::operator*(&local_a8,&local_e8,&local_68);
  local_128.m_basis.m_el[0].m_floats[0] = local_a8.m_basis.m_el[0].m_floats[0];
  local_128.m_basis.m_el[0].m_floats[1] = local_a8.m_basis.m_el[0].m_floats[1];
  local_128.m_basis.m_el[0].m_floats[2] = local_a8.m_basis.m_el[0].m_floats[2];
  local_128.m_basis.m_el[0].m_floats[3] = local_a8.m_basis.m_el[0].m_floats[3];
  local_128.m_basis.m_el[1].m_floats[0] = local_a8.m_basis.m_el[1].m_floats[0];
  local_128.m_basis.m_el[1].m_floats[1] = local_a8.m_basis.m_el[1].m_floats[1];
  local_128.m_basis.m_el[1].m_floats[2] = local_a8.m_basis.m_el[1].m_floats[2];
  local_128.m_basis.m_el[1].m_floats[3] = local_a8.m_basis.m_el[1].m_floats[3];
  local_128.m_basis.m_el[2].m_floats[0] = local_a8.m_basis.m_el[2].m_floats[0];
  local_128.m_basis.m_el[2].m_floats[1] = local_a8.m_basis.m_el[2].m_floats[1];
  local_128.m_basis.m_el[2].m_floats[2] = local_a8.m_basis.m_el[2].m_floats[2];
  local_128.m_basis.m_el[2].m_floats[3] = local_a8.m_basis.m_el[2].m_floats[3];
  local_128.m_origin.m_floats[0] = local_a8.m_origin.m_floats[0];
  local_128.m_origin.m_floats[1] = local_a8.m_origin.m_floats[1];
  local_128.m_origin.m_floats[2] = local_a8.m_origin.m_floats[2];
  local_128.m_origin.m_floats[3] = local_a8.m_origin.m_floats[3];
  btTransformAabb(&local_158,this->m_collisionMarginTriangle,&local_128,&this->m_aabbMin,
                  &this->m_aabbMax);
  return;
}

Assistant:

void	btSoftBodyTriangleCallback::setTimeStepAndCounters(btScalar collisionMarginTriangle,const btCollisionObjectWrapper* triBodyWrap, const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	m_dispatchInfoPtr = &dispatchInfo;
	m_collisionMarginTriangle = collisionMarginTriangle+btScalar(BT_SOFTBODY_TRIANGLE_EXTRUSION);
	m_resultOut = resultOut;


	btVector3	aabbWorldSpaceMin,aabbWorldSpaceMax;
	m_softBody->getAabb(aabbWorldSpaceMin,aabbWorldSpaceMax);
	btVector3 halfExtents = (aabbWorldSpaceMax-aabbWorldSpaceMin)*btScalar(0.5);
	btVector3 softBodyCenter = (aabbWorldSpaceMax+aabbWorldSpaceMin)*btScalar(0.5);

	btTransform softTransform;
	softTransform.setIdentity();
	softTransform.setOrigin(softBodyCenter);

	btTransform convexInTriangleSpace;
	convexInTriangleSpace = triBodyWrap->getWorldTransform().inverse() * softTransform;
	btTransformAabb(halfExtents,m_collisionMarginTriangle,convexInTriangleSpace,m_aabbMin,m_aabbMax);
}